

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnLocalGetExpr
          (BinaryReaderInterp *this,Index param_1)

{
  Index index;
  bool bVar1;
  Location local_90;
  Var local_70;
  Enum local_24;
  Index local_20;
  Index local_1c;
  Index translated_local_index;
  Index local_index_local;
  BinaryReaderInterp *this_local;
  
  local_1c = param_1;
  _translated_local_index = this;
  local_20 = TranslateLocalIndex(this,param_1);
  index = local_1c;
  Location::Location(&local_90);
  Var::Var(&local_70,index,&local_90);
  local_24 = (Enum)SharedValidator::OnLocalGet
                             (&this->validator_,
                              (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_70);
  bVar1 = Failed((Result)local_24);
  Var::~Var(&local_70);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,LocalGet,local_20);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnLocalGetExpr(Index local_index) {
  // Get the translated index before calling validator_.OnLocalGet because it
  // will update the type stack size. We need the index to be relative to the
  // old stack size.
  Index translated_local_index = TranslateLocalIndex(local_index);
  CHECK_RESULT(validator_.OnLocalGet(loc, Var(local_index)));
  istream_.Emit(Opcode::LocalGet, translated_local_index);
  return Result::Ok;
}